

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalReturnDynamic(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_3> local_38;
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  pfVar2 = tcu::Vector<float,_4>::x(&c->coords);
  fVar1 = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_1c._12_8_);
  if (fVar1 + *pfVar2 < 0.0) {
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)local_1c._12_8_,3,2);
  }
  else {
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)local_1c._12_8_,0,1);
  }
  tcu::Vector<float,_4>::xyz(&local_38,(Vec4 *)(local_1c._12_8_ + 0x1f0));
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_1c);
  return;
}

Assistant:

inline void evalReturnDynamic	(ShaderEvalContext& c) { c.color.xyz() = (c.coords.x()+c.coords.y() >= 0.0f) ? c.coords.swizzle(0,1,2) : c.coords.swizzle(3,2,1); }